

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchThreadLock_Test::
~CountdownLatchTest_TestCountdownLatchThreadLock_Test
          (CountdownLatchTest_TestCountdownLatchThreadLock_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchThreadLock)
{
    std::shared_ptr<CountdownLatch> latch = std::make_unique<CountdownLatch>(2);
    std::chrono::time_point<std::chrono::system_clock> start = std::chrono::system_clock::now();
    std::thread thread(SleepThenCountdownLatch, latch, std::chrono::seconds(1), 2);
    bool result = latch->Await(std::chrono::seconds(30));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_TRUE(result);
    EXPECT_EQ(0, latch->GetCount());
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(),std::chrono::seconds(30));
    thread.join();
}